

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::addMayerTerm
          (OptimalControlProblem *this,double weight,
          shared_ptr<iDynTree::optimalcontrol::L2NormCost> *quadraticCost)

{
  undefined1 uVar1;
  byte bVar2;
  element_type *this_00;
  undefined8 *in_RDI;
  bool bVar3;
  allocator<char> *in_XMM0_Qa;
  TimeRange *this_01;
  TimeRange newTimerange;
  string *in_stack_000005f0;
  undefined1 in_stack_000005fe;
  undefined1 in_stack_000005ff;
  shared_ptr<iDynTree::optimalcontrol::Cost> *in_stack_00000600;
  TimeRange *in_stack_00000608;
  double in_stack_00000610;
  OptimalControlProblemPimpl *in_stack_00000618;
  shared_ptr<iDynTree::optimalcontrol::L2NormCost> *in_stack_ffffffffffffff38;
  shared_ptr<iDynTree::optimalcontrol::Cost> *in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_69;
  string local_68 [80];
  allocator<char> *local_18;
  
  local_18 = in_XMM0_Qa;
  this_01 = (TimeRange *)TimeRange::endTime((TimeRange *)*in_RDI);
  TimeRange::endTime((TimeRange *)*in_RDI);
  TimeRange::TimeRange
            (this_01,(double)CONCAT17(in_stack_ffffffffffffff4f,
                                      CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48))
             ,(double)in_stack_ffffffffffffff40);
  std::shared_ptr<iDynTree::optimalcontrol::Cost>::
  shared_ptr<iDynTree::optimalcontrol::L2NormCost,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __s = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_ffffffffffffff80,(char *)__s,local_18)
  ;
  uVar1 = OptimalControlProblemPimpl::addCost
                    (in_stack_00000618,in_stack_00000610,in_stack_00000608,in_stack_00000600,
                     (bool)in_stack_000005ff,(bool)in_stack_000005fe,in_stack_000005f0);
  bVar2 = uVar1 ^ 0xff;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  std::shared_ptr<iDynTree::optimalcontrol::Cost>::~shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::Cost> *)0x2fa736);
  bVar3 = (bVar2 & 1) == 0;
  if (bVar3) {
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::L2NormCost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::L2NormCost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2fa7a8);
    Cost::name_abi_cxx11_(&this_00->super_Cost);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01,(value_type *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff48)));
  }
  return bVar3;
}

Assistant:

bool OptimalControlProblem::addMayerTerm(double weight, std::shared_ptr<L2NormCost> quadraticCost)
        {
            TimeRange newTimerange(m_pimpl->horizon.endTime(), m_pimpl->horizon.endTime());
            if (!(m_pimpl->addCost(weight, newTimerange, quadraticCost, false, true, "addMayerTerm"))) {
                return false;
            }
            m_pimpl->mayerCostnames.push_back(quadraticCost->name());

            return true;
        }